

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O0

QSize __thiscall QRadioButton::sizeHint(QRadioButton *this)

{
  bool bVar1;
  QRadioButtonPrivate *pQVar2;
  QRect *this_00;
  ulong uVar3;
  QStyle *pQVar4;
  QSize QVar5;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRadioButtonPrivate *d;
  QSize sz;
  QStyleOptionButton opt;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QStyleOptionButton *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QSize *in_stack_ffffffffffffff00;
  QWidget *this_01;
  int local_d8;
  int local_d4;
  QSize local_d0;
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  QFontMetrics local_a0 [8];
  undefined1 local_98 [16];
  QSize local_88;
  QSize local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = d_func((QRadioButton *)0x667f60);
  bVar1 = QSize::isValid(in_stack_ffffffffffffff00);
  if (bVar1) {
    local_80 = (pQVar2->super_QAbstractButtonPrivate).sizeHint;
  }
  else {
    QWidget::ensurePolished(this_01);
    memset(local_78,0xaa,0x70);
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x667fc3);
    (**(code **)(*(long *)in_RDI + 0x1b8))(in_RDI,local_78);
    local_88 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QRect *)QWidget::style((QWidget *)
                                      CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
    ;
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QRect::QRect((QRect *)in_stack_fffffffffffffef0);
    QAbstractButton::text
              ((QAbstractButton *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_98 = (**(code **)(*(long *)this_00 + 0x88))(this_00,local_a0,local_b0,0x800,0,local_c8);
    local_88 = QRect::size(this_00);
    QString::~QString((QString *)0x668073);
    QFontMetrics::~QFontMetrics(local_a0);
    uVar3 = QIcon::isNull();
    if ((uVar3 & 1) == 0) {
      QSize::width((QSize *)0x6680a3);
      QSize::width((QSize *)0x6680b8);
      local_d4 = QSize::height((QSize *)0x6680d4);
      local_d8 = QSize::height((QSize *)0x6680e9);
      qMax<int>(&local_d4,&local_d8);
      QSize::QSize((QSize *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                   in_stack_fffffffffffffee8);
      local_88 = local_d0;
    }
    pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           );
    QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,2,local_78,&local_88,in_RDI);
    (pQVar2->super_QAbstractButtonPrivate).sizeHint = QVar5;
    local_80 = (pQVar2->super_QAbstractButtonPrivate).sizeHint;
    QStyleOptionButton::~QStyleOptionButton(in_stack_fffffffffffffef0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_80;
  }
  __stack_chk_fail();
}

Assistant:

QSize QRadioButton::sizeHint() const
{
    Q_D(const QRadioButton);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();
    QStyleOptionButton opt;
    initStyleOption(&opt);
    QSize sz = style()->itemTextRect(fontMetrics(), QRect(), Qt::TextShowMnemonic,
                                     false, text()).size();
    if (!opt.icon.isNull())
        sz = QSize(sz.width() + opt.iconSize.width() + 4, qMax(sz.height(), opt.iconSize.height()));
    d->sizeHint = style()->sizeFromContents(QStyle::CT_RadioButton, &opt, sz, this);
    return d->sizeHint;
}